

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix33<float> *M)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  Matrix33<float> *in_RSI;
  Vec3<float> *in_RDI;
  double dVar6;
  float t;
  float cy;
  Matrix44<float> N_1;
  Vec3<float> r_1;
  float sy;
  Matrix44<float> N;
  Vec3<float> r;
  int k;
  int j;
  int i;
  float fVar7;
  undefined4 in_stack_fffffffffffffd84;
  float fVar8;
  undefined4 in_stack_fffffffffffffd8c;
  float local_210;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  float fVar9;
  undefined4 in_stack_fffffffffffffe00;
  float fVar10;
  undefined4 in_stack_fffffffffffffe04;
  float fVar11;
  float local_1d0;
  Matrix44<float> local_1b8;
  Matrix44<float> local_178;
  Matrix44<float> local_138;
  Vec3<float> local_f8;
  undefined4 local_ec;
  Matrix44<float> local_e8;
  Matrix44<float> local_a8;
  Matrix44<float> local_68;
  Vec3<float> local_28;
  int local_1c;
  int local_18;
  int local_14;
  Matrix33<float> *local_10;
  
  local_10 = in_RSI;
  angleOrder((Euler<float> *)in_RDI,&local_14,&local_18,&local_1c);
  if ((*(byte *)&in_RDI[1].x >> 1 & 1) == 0) {
    pfVar5 = Matrix33<float>::operator[](local_10,local_18);
    fVar9 = pfVar5[local_1c];
    pfVar5 = Matrix33<float>::operator[](local_10,local_1c);
    dVar6 = std::atan2((double)(ulong)(uint)fVar9,(double)(ulong)(uint)pfVar5[local_1c]);
    in_RDI->x = SUB84(dVar6,0);
    Vec3<float>::Vec3(&local_f8,0.0,0.0,0.0);
    if ((*(byte *)&in_RDI[1].x >> 2 & 1) == 0) {
      local_210 = in_RDI->x;
    }
    else {
      local_210 = -in_RDI->x;
    }
    pfVar5 = Vec3<float>::operator[](&local_f8,local_14);
    *pfVar5 = local_210;
    Matrix44<float>::Matrix44(&local_138);
    Matrix44<float>::rotate<float>
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    pfVar5 = Matrix33<float>::operator[](local_10,0);
    fVar9 = *pfVar5;
    pfVar5 = Matrix33<float>::operator[](local_10,0);
    fVar10 = pfVar5[1];
    pfVar5 = Matrix33<float>::operator[](local_10,0);
    fVar11 = pfVar5[2];
    pfVar5 = Matrix33<float>::operator[](local_10,1);
    fVar1 = *pfVar5;
    pfVar5 = Matrix33<float>::operator[](local_10,1);
    fVar2 = pfVar5[1];
    pfVar5 = Matrix33<float>::operator[](local_10,1);
    fVar3 = pfVar5[2];
    pfVar5 = Matrix33<float>::operator[](local_10,2);
    fVar4 = *pfVar5;
    pfVar5 = Matrix33<float>::operator[](local_10,2);
    fVar7 = pfVar5[1];
    pfVar5 = Matrix33<float>::operator[](local_10,2);
    fVar8 = pfVar5[2];
    Matrix44<float>::Matrix44
              (&local_1b8,fVar9,fVar10,fVar11,0.0,fVar1,fVar2,fVar3,0.0,fVar4,fVar7,fVar8,0.0,0.0,
               0.0,0.0,1.0);
    Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd8c,fVar8),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd84,fVar7));
    Matrix44<float>::operator=(&local_138,&local_178);
    pfVar5 = Matrix44<float>::operator[](&local_138,local_14);
    fVar9 = pfVar5[local_14];
    pfVar5 = Matrix44<float>::operator[](&local_138,local_14);
    fVar10 = pfVar5[local_14];
    pfVar5 = Matrix44<float>::operator[](&local_138,local_14);
    fVar11 = pfVar5[local_18];
    pfVar5 = Matrix44<float>::operator[](&local_138,local_14);
    dVar6 = std::sqrt((double)(ulong)(uint)(fVar9 * fVar10 + fVar11 * pfVar5[local_18]));
    pfVar5 = Matrix44<float>::operator[](&local_138,local_14);
    dVar6 = std::atan2((double)(ulong)(uint)-pfVar5[local_1c],(double)((ulong)dVar6 & 0xffffffff));
    in_RDI->y = SUB84(dVar6,0);
    pfVar5 = Matrix44<float>::operator[](&local_138,local_18);
    fVar9 = pfVar5[local_14];
    pfVar5 = Matrix44<float>::operator[](&local_138,local_18);
    dVar6 = std::atan2((double)(ulong)(uint)-fVar9,(double)(ulong)(uint)pfVar5[local_18]);
    in_RDI->z = SUB84(dVar6,0);
  }
  else {
    pfVar5 = Matrix33<float>::operator[](local_10,local_18);
    fVar9 = pfVar5[local_14];
    pfVar5 = Matrix33<float>::operator[](local_10,local_1c);
    dVar6 = std::atan2((double)(ulong)(uint)fVar9,(double)(ulong)(uint)pfVar5[local_14]);
    in_RDI->x = SUB84(dVar6,0);
    Vec3<float>::Vec3(&local_28,0.0,0.0,0.0);
    if ((*(byte *)&in_RDI[1].x >> 2 & 1) == 0) {
      local_1d0 = in_RDI->x;
    }
    else {
      local_1d0 = -in_RDI->x;
    }
    pfVar5 = Vec3<float>::operator[](&local_28,local_14);
    *pfVar5 = local_1d0;
    Matrix44<float>::Matrix44(&local_68);
    Matrix44<float>::rotate<float>
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffdfc,local_1d0));
    pfVar5 = Matrix33<float>::operator[](local_10,0);
    fVar9 = *pfVar5;
    pfVar5 = Matrix33<float>::operator[](local_10,0);
    fVar10 = pfVar5[1];
    pfVar5 = Matrix33<float>::operator[](local_10,0);
    fVar11 = pfVar5[2];
    pfVar5 = Matrix33<float>::operator[](local_10,1);
    fVar1 = *pfVar5;
    pfVar5 = Matrix33<float>::operator[](local_10,1);
    fVar2 = pfVar5[1];
    pfVar5 = Matrix33<float>::operator[](local_10,1);
    fVar3 = pfVar5[2];
    pfVar5 = Matrix33<float>::operator[](local_10,2);
    fVar4 = *pfVar5;
    pfVar5 = Matrix33<float>::operator[](local_10,2);
    fVar7 = pfVar5[1];
    pfVar5 = Matrix33<float>::operator[](local_10,2);
    fVar8 = pfVar5[2];
    Matrix44<float>::Matrix44
              (&local_e8,fVar9,fVar10,fVar11,0.0,fVar1,fVar2,fVar3,0.0,fVar4,fVar7,fVar8,0.0,0.0,0.0
               ,0.0,1.0);
    Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd8c,fVar8),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd84,fVar7));
    Matrix44<float>::operator=(&local_68,&local_a8);
    pfVar5 = Matrix44<float>::operator[](&local_68,local_18);
    fVar9 = pfVar5[local_14];
    pfVar5 = Matrix44<float>::operator[](&local_68,local_18);
    fVar10 = pfVar5[local_14];
    pfVar5 = Matrix44<float>::operator[](&local_68,local_1c);
    fVar11 = pfVar5[local_14];
    pfVar5 = Matrix44<float>::operator[](&local_68,local_1c);
    dVar6 = std::sqrt((double)(ulong)(uint)(fVar9 * fVar10 + fVar11 * pfVar5[local_14]));
    local_ec = SUB84(dVar6,0);
    pfVar5 = Matrix44<float>::operator[](&local_68,local_14);
    dVar6 = std::atan2((double)((ulong)dVar6 & 0xffffffff),(double)(ulong)(uint)pfVar5[local_14]);
    in_RDI->y = SUB84(dVar6,0);
    pfVar5 = Matrix44<float>::operator[](&local_68,local_18);
    fVar9 = pfVar5[local_1c];
    pfVar5 = Matrix44<float>::operator[](&local_68,local_18);
    dVar6 = std::atan2((double)(ulong)(uint)fVar9,(double)(ulong)(uint)pfVar5[local_18]);
    in_RDI->z = SUB84(dVar6,0);
  }
  if ((*(byte *)&in_RDI[1].x >> 2 & 1) == 0) {
    Vec3<float>::operator*=(in_RDI,-1.0);
  }
  if (((uint)in_RDI[1].x & 1) == 0) {
    fVar9 = in_RDI->x;
    in_RDI->x = in_RDI->z;
    in_RDI->z = fVar9;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix33<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}